

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.h
# Opt level: O1

void __thiscall CVmObjGramProd::check_circular_refs(CVmObjGramProd *this,vm_obj_id_t self)

{
  byte *pbVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  
  pbVar1 = (byte *)((this->super_CVmObject).ext_ + 0x14);
  *pbVar1 = *pbVar1 & 0xfb;
  pcVar2 = (this->super_CVmObject).ext_;
  if (*(long *)(pcVar2 + 0x38) != 0) {
    lVar4 = 0;
    do {
      lVar3 = *(long *)(*(long *)(pcVar2 + 0x30) + lVar4 * 8);
      if (((*(long *)(lVar3 + 0x18) != 0) &&
          (lVar3 = *(long *)(lVar3 + 0x10), *(char *)(lVar3 + 2) == '\x01')) &&
         (*(vm_obj_id_t *)(lVar3 + 8) == self)) {
        pcVar2[0x14] = pcVar2[0x14] | 4;
        return;
      }
      lVar4 = lVar4 + 1;
    } while (*(long *)(pcVar2 + 0x38) != lVar4);
  }
  return;
}

Assistant:

vm_gram_ext *get_ext() const { return (vm_gram_ext *)ext_; }